

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall
ON_BinaryArchive::Read3dmChunkVersion(ON_BinaryArchive *this,int *major_version,int *minor_version)

{
  undefined1 in_AL;
  bool bVar1;
  undefined7 in_register_00000001;
  uchar v;
  undefined8 uStack_18;
  
  uStack_18 = CONCAT71(in_register_00000001,in_AL) & 0xffffffffffffff;
  bVar1 = ReadChar(this,(ON__UINT8 *)((long)&uStack_18 + 7));
  if (minor_version != (int *)0x0) {
    *minor_version = uStack_18._7_1_ & 0xf;
  }
  if (major_version != (int *)0x0) {
    *major_version = (uint)(uStack_18._7_1_ >> 4);
  }
  return bVar1;
}

Assistant:

bool ON_BinaryArchive::Read3dmChunkVersion(
  int* major_version, // major // 0 to 15
  int* minor_version // minor // 0 to 16
  )
{
  unsigned char v = 0;
  bool rc = ReadChar( &v );
  if ( minor_version) *minor_version = v%16;
  // The bit shift happens on the fly in the following
  // if statement.  It was happening twice which always
  // set the major version to 0
  //v >>= 4;
  if ( major_version) *major_version = (v>>4);
  return rc;
}